

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadUpvalues(LoadState *S,Proto *f)

{
  lu_byte lVar1;
  int iVar2;
  Upvaldesc *pUVar3;
  int local_1c;
  int n;
  int i;
  Proto *f_local;
  LoadState *S_local;
  
  iVar2 = LoadInt(S);
  pUVar3 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar2 << 4);
  f->upvalues = pUVar3;
  f->sizeupvalues = iVar2;
  for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
    f->upvalues[local_1c].name = (TString *)0x0;
  }
  for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
    lVar1 = LoadByte(S);
    f->upvalues[local_1c].instack = lVar1;
    lVar1 = LoadByte(S);
    f->upvalues[local_1c].idx = lVar1;
  }
  return;
}

Assistant:

static void LoadUpvalues (LoadState *S, Proto *f) {
  int i, n;
  n = LoadInt(S);
  f->upvalues = luaM_newvector(S->L, n, Upvaldesc);
  f->sizeupvalues = n;
  for (i = 0; i < n; i++)
    f->upvalues[i].name = NULL;
  for (i = 0; i < n; i++) {
    f->upvalues[i].instack = LoadByte(S);
    f->upvalues[i].idx = LoadByte(S);
  }
}